

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_args_DSSSS(Context *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int retval;
  Context *ctx_local;
  
  iVar1 = parse_destination_token(ctx,&ctx->dest_arg);
  iVar2 = parse_source_token(ctx,ctx->source_args);
  iVar3 = parse_source_token(ctx,ctx->source_args + 1);
  iVar4 = parse_source_token(ctx,ctx->source_args + 2);
  iVar5 = parse_source_token(ctx,ctx->source_args + 3);
  return iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + 1;
}

Assistant:

static int parse_args_DSSSS(Context *ctx)
{
    int retval = 1;
    retval += parse_destination_token(ctx, &ctx->dest_arg);
    retval += parse_source_token(ctx, &ctx->source_args[0]);
    retval += parse_source_token(ctx, &ctx->source_args[1]);
    retval += parse_source_token(ctx, &ctx->source_args[2]);
    retval += parse_source_token(ctx, &ctx->source_args[3]);
    return retval;
}